

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
 absl::lts_20250127::time_internal::cctz::TimeZoneInfo::UTC(void)

{
  TimeZoneInfo *this;
  pointer this_00;
  __uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
  in_RDI;
  seconds local_20;
  undefined1 local_11;
  unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
  *tz;
  
  local_11 = 0;
  this = (TimeZoneInfo *)operator_new(0xc0);
  TimeZoneInfo(this);
  std::
  unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>>
  ::unique_ptr<std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,void>
            ((unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>>
              *)in_RDI.
                super___uniq_ptr_impl<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_false>
                ._M_head_impl,this);
  this_00 = std::
            unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
            ::operator->((unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                          *)in_RDI.
                            super___uniq_ptr_impl<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
                            .
                            super__Head_base<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_false>
                            ._M_head_impl);
  local_20.__r = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
  ResetToBuiltinUTC(this_00,&local_20);
  return (__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>,_true,_true>
          )(tuple<absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
            )in_RDI.
             super___uniq_ptr_impl<absl::lts_20250127::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneInfo>_>
             .super__Head_base<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneInfo_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<TimeZoneInfo> TimeZoneInfo::UTC() {
  auto tz = std::unique_ptr<TimeZoneInfo>(new TimeZoneInfo);
  tz->ResetToBuiltinUTC(seconds::zero());
  return tz;
}